

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form3_Prewitt(PrewittForm3 Prewitt)

{
  bool bVar1;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  bVar1 = true;
  if (2 < roiHeight && 2 < roiWidth) {
    (*Prewitt)(&output,&input,roiX,roiY,roiWidth,roiHeight);
    bVar1 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
    if (bVar1) {
      bVar1 = Unit_Test::verifyImage(&output,'\0');
    }
    else {
      bVar1 = false;
    }
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return bVar1;
}

Assistant:

bool form3_Prewitt(PrewittForm3 Prewitt)
    {
        const PenguinV_Image::Image input = uniformImage();

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );
        if ( (roiWidth < 3) || (roiHeight < 3) )
            return true;

        const PenguinV_Image::Image output = Prewitt( input, roiX, roiY, roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, 0u );
    }